

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O1

int anon_unknown.dwarf_261f2::ChannelOut_allnotesoff(lua_State *L)

{
  long *plVar1;
  char local_b [3];
  
  plVar1 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  local_b[0] = (char)plVar1[1] + -0x50;
  local_b[1] = '{';
  local_b[2] = '\0';
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),local_b,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_allnotesoff(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, 0x7B, 0x00);
	lua_settop(L, 1);
	return 1;
}